

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmfilegen.cpp
# Opt level: O0

ByteString * validate_chunk(ByteString *FB,ByteString *CB,ui32_t *nonce_value)

{
  ui32_t uVar1;
  ui32_t uVar2;
  ui32_t uVar3;
  int iVar4;
  byte_t *pbVar5;
  byte_t *pbVar6;
  long in_RCX;
  undefined1 local_f8 [8];
  CTR_Setup counter;
  ui32_t *nonce_value_local;
  ByteString *CB_local;
  ByteString *FB_local;
  
  if (in_RCX != 0) {
    counter._200_8_ = in_RCX;
    CTR_Setup::CTR_Setup((CTR_Setup *)local_f8);
    pbVar5 = Kumu::ByteString::RoData(CB);
    CTR_Setup::SetupRead((CTR_Setup *)local_f8,pbVar5);
    pbVar5 = Kumu::ByteString::Data((ByteString *)nonce_value);
    uVar1 = CTR_Setup::WriteSize((CTR_Setup *)local_f8);
    uVar2 = CTR_Setup::WriteSize((CTR_Setup *)local_f8);
    CTR_Setup::FillRandom((CTR_Setup *)local_f8,pbVar5 + uVar1,0x100000 - uVar2);
    pbVar5 = Kumu::ByteString::RoData(CB);
    uVar1 = CTR_Setup::WriteSize((CTR_Setup *)local_f8);
    pbVar6 = Kumu::ByteString::RoData((ByteString *)nonce_value);
    uVar2 = CTR_Setup::WriteSize((CTR_Setup *)local_f8);
    uVar3 = CTR_Setup::WriteSize((CTR_Setup *)local_f8);
    iVar4 = memcmp(pbVar5 + uVar1,pbVar6 + uVar2,(ulong)(0x100000 - uVar3));
    if (iVar4 == 0) {
      uVar1 = CTR_Setup::Nonce((CTR_Setup *)local_f8);
      *(ui32_t *)counter._200_8_ = uVar1;
      Kumu::Result_t::Result_t((Result_t *)FB,(Result_t *)Kumu::RESULT_OK);
    }
    else {
      fprintf(_stderr,"Check data mismatched in chunk\n");
      Kumu::Result_t::Result_t((Result_t *)FB,(Result_t *)Kumu::RESULT_FAIL);
    }
    CTR_Setup::~CTR_Setup((CTR_Setup *)local_f8);
    return FB;
  }
  __assert_fail("nonce_value",
                "/workspace/llm4binary/github/license_c_cmakelists/cinecert[P]asdcplib/src/kmfilegen.cpp"
                ,0x14a,"Result_t validate_chunk(ByteString &, ByteString &, ui32_t *)");
}

Assistant:

Result_t
validate_chunk(ByteString& FB, ByteString& CB, ui32_t* nonce_value)
{
  assert(nonce_value);
  CTR_Setup counter;
  counter.SetupRead(FB.RoData());

  counter.FillRandom(CB.Data() + counter.WriteSize(),
		     Megabyte - counter.WriteSize());

  if ( memcmp(FB.RoData() + counter.WriteSize(),
	      CB.RoData() + counter.WriteSize(),
	      Megabyte - counter.WriteSize()) != 0 )
    {
      fprintf(stderr, "Check data mismatched in chunk\n");
      return RESULT_FAIL;
    }

  *nonce_value = counter.Nonce();

  return RESULT_OK;
}